

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Recorder::Get_y(ChFunction_Recorder *this,double x)

{
  list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *plVar1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  _List_node_base *p_Var6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  _List_node_base *p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  plVar1 = &this->m_points;
  p_Var3 = (this->m_points).
           super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node
           .super__List_node_base._M_next;
  p_Var10 = (_List_node_base *)0x0;
  if (p_Var3 != (_List_node_base *)plVar1) {
    p_Var10 = p_Var3[1]._M_next;
    if (x <= (double)p_Var10) {
      p_Var10 = p_Var3[1]._M_prev;
    }
    else {
      p_Var6 = (this->m_points).
               super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      if ((double)p_Var6[1]._M_next <= x) {
        p_Var10 = p_Var6[1]._M_prev;
      }
      else {
        if ((this->m_last)._M_node == (_List_node_base *)plVar1) {
          (this->m_last)._M_node = p_Var3;
        }
        p_Var6 = (this->m_last)._M_node;
        if (x <= (double)p_Var6[1]._M_next) {
          while (bVar7 = p_Var3 != p_Var6, bVar7) {
            p_Var6 = p_Var6->_M_prev;
            p_Var10 = p_Var6[1]._M_next;
            if ((double)p_Var10 <= x) {
              p_Var4 = (this->m_last)._M_node;
              p_Var3 = p_Var4[1]._M_next;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = p_Var4[1]._M_prev;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = ((double)p_Var3 - x) * (double)p_Var6[1]._M_prev;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = x - (double)p_Var10;
              auVar5 = vfmadd231sd_fma(auVar9,auVar11,auVar5);
              p_Var10 = (_List_node_base *)(auVar5._0_8_ / ((double)p_Var3 - (double)p_Var10));
              break;
            }
            (this->m_last)._M_node = p_Var6;
          }
          if (bVar7) {
            return (double)p_Var10;
          }
        }
        else {
          for (; (_List_node_base *)plVar1 != p_Var6; p_Var6 = p_Var6->_M_next) {
            p_Var10 = p_Var6[1]._M_next;
            if (x <= (double)p_Var10) {
              p_Var4 = (this->m_last)._M_node;
              p_Var3 = p_Var4[1]._M_next;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = p_Var6[1]._M_prev;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = ((double)p_Var10 - x) * (double)p_Var4[1]._M_prev;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = x - (double)p_Var3;
              auVar5 = vfmadd231sd_fma(auVar8,auVar12,auVar2);
              p_Var10 = (_List_node_base *)(auVar5._0_8_ / ((double)p_Var10 - (double)p_Var3));
              break;
            }
            (this->m_last)._M_node = p_Var6;
          }
          if ((_List_node_base *)plVar1 != p_Var6) {
            return (double)p_Var10;
          }
        }
        p_Var10 = (_List_node_base *)0x0;
      }
    }
  }
  return (double)p_Var10;
}

Assistant:

double ChFunction_Recorder::Get_y(double x) const {
    if (m_points.empty()) {
        return 0;
    }

    if (x <= m_points.front().x) {
        return m_points.front().y;
    }

    if (x >= m_points.back().x) {
        return m_points.back().y;
    }

    // At this point we are guaranteed that there are at least two records.

    if (m_last == m_points.end()) {
        m_last = m_points.begin();
    }

    if (x > m_last->x) {
        // Search to the right
        for (auto iter = m_last; iter != m_points.end(); ++iter) {
            if (x <= iter->x) {
                return Interpolate_y(x, *m_last, *iter);
            }
            m_last = iter;
        }
    } else {
        // Search to the left
        for (auto iter = m_last; iter != m_points.begin();) {
            --iter;
            if (x >= iter->x) {
                return Interpolate_y(x, *iter, *m_last);
            }
            m_last = iter;
        }
    }

    return 0;
}